

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::ScrollArea::sizeHint(ScrollArea *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AbstractScrollAreaPrivate *pAVar4;
  AbstractScrollArea *pAVar5;
  long lVar6;
  int iVar7;
  int extraout_EAX;
  int iVar8;
  int iVar9;
  int extraout_var;
  QSize QVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  QFontMetrics local_30 [8];
  
  pAVar4 = (this->super_AbstractScrollArea).d.d;
  QFontMetrics::QFontMetrics
            (local_30,(QFont *)(*(long *)&(this->super_AbstractScrollArea).field_0x20 + 0x38));
  iVar7 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics(local_30);
  if (((pAVar4[1]._vptr_AbstractScrollAreaPrivate == (_func_int **)0x0) ||
      (*(int *)((long)pAVar4[1]._vptr_AbstractScrollAreaPrivate + 4) == 0)) ||
     (pAVar5 = pAVar4[1].q, pAVar5 == (AbstractScrollArea *)0x0)) {
    iVar13 = iVar7 * 0xc;
    iVar11 = iVar7 * 8;
  }
  else if ((char)pAVar4[1].indicatorColor.cspec == Rgb) {
    (**(code **)(*(long *)pAVar5 + 0x70))();
    iVar11 = extraout_var;
    iVar13 = extraout_EAX;
  }
  else {
    lVar6 = *(long *)&pAVar5->field_0x20;
    iVar13 = (*(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14)) + 1;
    iVar11 = (*(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18)) + 1;
  }
  iVar12 = pAVar4->left;
  iVar1 = pAVar4->right;
  iVar2 = pAVar4->top;
  iVar3 = pAVar4->bottom;
  iVar8 = QFrame::frameWidth();
  iVar9 = QFrame::frameWidth();
  iVar13 = iVar13 + iVar12 + iVar1 + iVar8 * 2;
  iVar12 = iVar11 + iVar2 + iVar3 + iVar9 * 2;
  iVar11 = iVar7 * 0x24;
  if (SBORROW4(iVar13,iVar7 * 0x24) != iVar13 + iVar7 * -0x24 < 0) {
    iVar11 = iVar13;
  }
  iVar13 = iVar7 * 0x18;
  if (SBORROW4(iVar12,iVar7 * 0x18) != iVar12 + iVar7 * -0x18 < 0) {
    iVar13 = iVar12;
  }
  QVar10.ht = iVar13;
  QVar10.wd = iVar11;
  return QVar10;
}

Assistant:

QSize
ScrollArea::sizeHint() const
{
	const ScrollAreaPrivate * d = d_func();

	QSize sz( 0, 0 );
	const int h = fontMetrics().height();

	if( d->widget )
		sz += ( d->resizable ? d->widget->sizeHint() : d->widget->size() );
	else
		sz += QSize( 12 * h, 8 * h );

	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	sz += marginsSize + frameSize;

	return sz.boundedTo( QSize( 36 * h, 24 * h ) );
}